

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void mp::PrintModelInfo(FlatModelInfo *fmi,char *header,bool aux_vars)

{
  _Rb_tree_node_base *fullString;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  int iVar9;
  int extraout_EDX;
  int n;
  int n_00;
  int n_01;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int n_02;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  int n_03;
  int n_04;
  int n_05;
  int n_06;
  undefined8 extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  uint uVar10;
  char *arg0;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int *in_stack_fffffffffffffea8;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  int n_cones;
  undefined8 local_138;
  int local_130 [2];
  string local_128;
  char *local_108;
  ulong local_100;
  ulong local_f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  expr_alg;
  VarInfo vi;
  char *header_local;
  int nvb;
  int nvi;
  int nv;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  expr_logic;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  cones;
  
  iVar5 = (int)CONCAT71(in_register_00000011,aux_vars);
  header_local = header;
  (*fmi->_vptr_FlatModelInfo[4])(&vi,fmi);
  iVar9 = iVar5;
  iVar4 = iVar5;
  if (iVar5 != 0) {
    iVar5 = vi._M_elems[3];
    iVar9 = vi._M_elems[4];
    iVar4 = vi._M_elems[5];
  }
  nv = iVar5 + vi._M_elems[0];
  nvi = iVar9 + vi._M_elems[1];
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nvi;
  nvb = iVar4 + vi._M_elems[2];
  fmt::format<char_const*,int,int,int>
            ((string *)&expr_alg,(fmt *)"{} has {} variables ({} integer, {} binary);\n",
             (CStringRef)&header_local,(char **)&nv,(int *)args_1,&nvb,in_stack_fffffffffffffea8);
  fmt::print<>((CStringRef)expr_alg._M_t._M_impl._0_8_);
  std::__cxx11::string::~string((string *)&expr_alg);
  iVar5 = (*fmi->_vptr_FlatModelInfo[6])(fmi);
  local_138 = CONCAT44(extraout_var,iVar5);
  if (local_138 == 0 && extraout_EDX == 0) {
    arg0 = "No objectives;\n";
  }
  else {
    local_130[0] = extraout_EDX;
    fmt::print<>((CStringRef)0x2c222a);
    if ((int)local_138 != 0) {
      fmt::format<int>((string *)&expr_alg,(CStringRef)0x2c2237,(int *)&local_138);
      fmt::print<>((CStringRef)expr_alg._M_t._M_impl._0_8_);
      std::__cxx11::string::~string((string *)&expr_alg);
    }
    if (local_138._4_4_ != 0) {
      fmt::format<int>((string *)&expr_alg,(CStringRef)0x2c2243,(int *)((long)&local_138 + 4));
      fmt::print<>((CStringRef)expr_alg._M_t._M_impl._0_8_);
      std::__cxx11::string::~string((string *)&expr_alg);
    }
    arg0 = "\n";
    if (local_130[0] != 0) {
      fmt::format<int>((string *)&expr_alg,(CStringRef)0x2c2252,local_130);
      fmt::print<>((CStringRef)expr_alg._M_t._M_impl._0_8_);
      std::__cxx11::string::~string((string *)&expr_alg);
    }
  }
  fmt::print<>((CStringRef)arg0);
  iVar5 = (*fmi->_vptr_FlatModelInfo[10])(fmi);
  n_cones = 0;
  expr_alg._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &expr_alg._M_t._M_impl.super__Rb_tree_header._M_header;
  expr_alg._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expr_alg._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  expr_alg._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  expr_logic._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &expr_logic._M_t._M_impl.super__Rb_tree_header._M_header;
  expr_logic._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expr_logic._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  expr_logic._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cones._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cones._M_t._M_impl.super__Rb_tree_header._M_header;
  cones._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cones._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cones._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var_00,iVar5) + 0x18);
  local_150 = 0;
  local_108 = (char *)0x0;
  local_148 = 0;
  local_14c = 0;
  local_144 = 0;
  local_140 = 0;
  local_100 = 0;
  local_f8 = 0;
  uVar10 = 0;
  expr_alg._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       expr_alg._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  expr_logic._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       expr_logic._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cones._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cones._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar2 = local_f8;
    uVar1 = local_100;
    if (p_Var7 == (_Rb_tree_node_base *)(CONCAT44(extraout_var_00,iVar5) + 8)) {
      if ((int)local_f8 + uVar10 + (int)local_108 + (int)local_100 + n_cones + local_148 != 0) {
        fmt::print<>((CStringRef)0x2c229e);
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x2c23f4,(char *)(ulong)uVar10,n);
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x2adad7,(char *)(uVar2 & 0xffffffff),n_00);
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"nonlinear",(char *)(uVar1 & 0xffffffff),n_01);
        iVar5 = extraout_EDX_00;
        if (n_cones != 0) {
          fmt::format<int>(&local_128,(CStringRef)0x2c22b6,&n_cones);
          fmt::print<>((CStringRef)local_128._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_128);
          iVar5 = 1;
          p_Var8 = cones._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while ((_Rb_tree_header *)p_Var8 != &cones._M_t._M_impl.super__Rb_tree_header) {
            if (iVar5 != 1) {
              fmt::print<>((CStringRef)0x2bdc87);
            }
            fmt::format<int,std::__cxx11::string>
                      (&local_128,(fmt *)"{} {}",(CStringRef)(p_Var8 + 2),(int *)(p_Var8 + 1),args_1
                      );
            fmt::print<>((CStringRef)local_128._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_128);
            if (iVar5 != (int)cones._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              fmt::print<>((CStringRef)0x2bec7c);
            }
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
            iVar5 = iVar5 + 1;
          }
          fmt::print<>((CStringRef)0x2c22c8);
          iVar5 = extraout_EDX_01;
        }
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"SOS1",local_108,iVar5);
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"SOS2",(char *)(ulong)local_148,n_02);
        fmt::print<>((CStringRef)0x2bd523);
      }
      if (expr_alg._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        fmt::print<>((CStringRef)0x2c22d5);
        auVar11._8_8_ = extraout_RDX;
        auVar11._0_8_ = expr_alg._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (p_Var7 = auVar11._0_8_,
              (_Rb_tree_header *)p_Var7 != &expr_alg._M_t._M_impl.super__Rb_tree_header) {
          PrintModelInfo::anon_class_1_0_00000001::operator()
                    (*(anon_class_1_0_00000001 **)(p_Var7 + 1),(char *)(ulong)p_Var7[2]._M_color,
                     auVar11._8_4_);
          auVar11 = std::_Rb_tree_increment(p_Var7);
        }
        fmt::print<>((CStringRef)0x2bd523);
      }
      if ((((expr_logic._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) || (local_140 != 0))
          || (local_144 != 0)) || ((local_14c != 0 || (local_150 != 0)))) {
        fmt::print<>((CStringRef)0x2c22ed);
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)0x2c230d,(char *)(ulong)local_14c,n_03);
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"quadratic indicator(s)",(char *)(ulong)local_150,n_04
                  );
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"conditional (in)equalitie(s)",
                   (char *)(ulong)local_140,n_05);
        PrintModelInfo::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"conditional quadratic (in)equalitie(s)",
                   (char *)(ulong)local_144,n_06);
        auVar12._8_8_ = extraout_RDX_00;
        auVar12._0_8_ = expr_logic._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (p_Var7 = auVar12._0_8_,
              (_Rb_tree_header *)p_Var7 != &expr_logic._M_t._M_impl.super__Rb_tree_header) {
          PrintModelInfo::anon_class_1_0_00000001::operator()
                    (*(anon_class_1_0_00000001 **)(p_Var7 + 1),(char *)(ulong)p_Var7[2]._M_color,
                     auVar12._8_4_);
          auVar12 = std::_Rb_tree_increment(p_Var7);
        }
        fmt::print<>((CStringRef)0x2bd523);
      }
      fmt::print<>((CStringRef)0x2bd523);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&cones._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&expr_logic._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&expr_alg._M_t);
      return;
    }
    if (*(int *)((long)&p_Var7[2]._M_parent + 4) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"_lin",(allocator<char> *)&stack0xfffffffffffffeaf);
      fullString = p_Var7 + 1;
      bVar3 = begins_with((string *)fullString,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      if (bVar3) {
        uVar10 = uVar10 + *(int *)((long)&p_Var7[2]._M_parent + 4);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"_quad",(allocator<char> *)&stack0xfffffffffffffeaf);
        bVar3 = begins_with((string *)fullString,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        if (bVar3) {
          local_f8 = (ulong)(uint)((int)local_f8 + *(int *)((long)&p_Var7[2]._M_parent + 4));
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,"cone",(allocator<char> *)&stack0xfffffffffffffeaf);
          bVar3 = ends_with((string *)fullString,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          if (bVar3) {
            iVar9 = *(int *)((long)&p_Var7[2]._M_parent + 4);
            n_cones = n_cones + iVar9;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_128,(char *)(*(long *)(p_Var7 + 2) + 1),
                       (allocator<char> *)&stack0xfffffffffffffeaf);
            piVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&cones,&local_128);
LAB_002894a1:
            *piVar6 = iVar9;
            std::__cxx11::string::~string((string *)&local_128);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_128,"_condlin",(allocator<char> *)&stack0xfffffffffffffeaf);
            bVar3 = begins_with((string *)fullString,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            if (bVar3) {
              local_140 = local_140 + *(int *)((long)&p_Var7[2]._M_parent + 4);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,"_condquad",
                         (allocator<char> *)&stack0xfffffffffffffeaf);
              bVar3 = begins_with((string *)fullString,&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              if (bVar3) {
                local_144 = local_144 + *(int *)((long)&p_Var7[2]._M_parent + 4);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_128,"_nl",(allocator<char> *)&stack0xfffffffffffffeaf);
                bVar3 = begins_with((string *)fullString,&local_128);
                std::__cxx11::string::~string((string *)&local_128);
                if (bVar3) {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)fullString,"_nlcon");
                  if (bVar3) {
                    local_100 = (ulong)(uint)((int)local_100 +
                                             *(int *)((long)&p_Var7[2]._M_parent + 4));
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_128,"_sos1",
                             (allocator<char> *)&stack0xfffffffffffffeaf);
                  bVar3 = begins_with((string *)fullString,&local_128);
                  std::__cxx11::string::~string((string *)&local_128);
                  if (bVar3) {
                    local_108 = (char *)(ulong)(uint)((int)local_108 +
                                                     *(int *)((long)&p_Var7[2]._M_parent + 4));
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_128,"_sos2",
                               (allocator<char> *)&stack0xfffffffffffffeaf);
                    bVar3 = begins_with((string *)fullString,&local_128);
                    std::__cxx11::string::~string((string *)&local_128);
                    if (bVar3) {
                      local_148 = local_148 + *(int *)((long)&p_Var7[2]._M_parent + 4);
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_128,"_indlin",
                                 (allocator<char> *)&stack0xfffffffffffffeaf);
                      bVar3 = begins_with((string *)fullString,&local_128);
                      std::__cxx11::string::~string((string *)&local_128);
                      if (bVar3) {
                        local_14c = local_14c + *(int *)((long)&p_Var7[2]._M_parent + 4);
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_128,"_indquad",
                                   (allocator<char> *)&stack0xfffffffffffffeaf);
                        bVar3 = begins_with((string *)fullString,&local_128);
                        std::__cxx11::string::~string((string *)&local_128);
                        if (bVar3) {
                          local_150 = local_150 + *(int *)((long)&p_Var7[2]._M_parent + 4);
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_128,"_uenc",
                                     (allocator<char> *)&stack0xfffffffffffffeaf);
                          bVar3 = begins_with((string *)fullString,&local_128);
                          std::__cxx11::string::~string((string *)&local_128);
                          if (!bVar3) {
                            iVar9 = *(int *)((long)&p_Var7[2]._M_parent + 4);
                            if (*(char *)&p_Var7[2]._M_parent == '\x01') {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_128,(char *)(*(long *)(p_Var7 + 2) + 1),
                                         (allocator<char> *)&stack0xfffffffffffffeaf);
                              piVar6 = std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                       ::operator[](&expr_logic,&local_128);
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_128,(char *)(*(long *)(p_Var7 + 2) + 1),
                                         (allocator<char> *)&stack0xfffffffffffffeaf);
                              piVar6 = std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                       ::operator[](&expr_alg,&local_128);
                            }
                            goto LAB_002894a1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void PrintModelInfo(const FlatModelInfo& fmi,
    const char* header, bool aux_vars) {
  auto vi = fmi.GetVarInfo();
  int nv = vi[0] + aux_vars*vi[3];
  int nvi = vi[1] + aux_vars*vi[4];
  int nvb = vi[2] + aux_vars*vi[5];
  fmt::print(fmt::format(
      "{} has {} variables ({} integer, {} binary);\n",
      header, nv, nvi, nvb));
  auto oi = fmi.GetObjInfo();
  if (true || 1!=oi[0] || oi[1] || oi[2]) {
    if (!oi[0] && !oi[1] && !oi[2])
      fmt::print("No objectives;\n");
    else {
      fmt::print("Objectives: ");
      if (oi[0])
        fmt::print(fmt::format("{} linear; ", oi[0]));
      if (oi[1])
        fmt::print(fmt::format("{} quadratic; ", oi[1]));
      if (oi[2])
        fmt::print(fmt::format("{} nonlinear; ", oi[2]));
      fmt::print("\n");
    }
  }
  const auto& coninfo = fmi.GetConstraintTypes();
  int n_lin = 0;
  int n_quad = 0;
  int n_nl = 0;
  int n_cones = 0;
  int n_condlin = 0, n_condquad = 0;
  int n_indlin = 0, n_indquad = 0;
  int n_sos1 = 0, n_sos2 = 0;
  std::map<std::string, int> expr_alg, expr_logic, cones;
  auto NewName = [](const char* old) { return old+1; };  // skip _
  for (const auto& val: coninfo) {
    if (val.second.n_) {
      if (begins_with(val.first, "_lin"))
        n_lin += val.second.n_;
      else if (begins_with(val.first, "_quad"))
        n_quad += val.second.n_;
      else if (ends_with(val.first, "cone")) {
        n_cones += val.second.n_;
        cones[NewName(val.second.name_)] = val.second.n_;
      }
      else if (begins_with(val.first, "_condlin"))
        n_condlin += val.second.n_;
      else if (begins_with(val.first, "_condquad"))
        n_condquad += val.second.n_;
      else if (begins_with(val.first, "_nl")) {
        if (val.first == "_nlcon")
          n_nl += val.second.n_;
      }  // else, NL assignment or logical - skip
      else if (begins_with(val.first, "_sos1"))
        n_sos1 += val.second.n_;
      else if (begins_with(val.first, "_sos2"))
        n_sos2 += val.second.n_;
      else if (begins_with(val.first, "_indlin"))
        n_indlin += val.second.n_;
      else if (begins_with(val.first, "_indquad"))
        n_indquad += val.second.n_;
      else if (begins_with(val.first, "_uenc"))
      { }
      // Else, it's expressions
      else if (val.second.is_logical_)
        expr_logic[NewName(val.second.name_)] = val.second.n_;
      else
        expr_alg[NewName(val.second.name_)] = val.second.n_;
    }
  }
  auto PrnType = [](const char* descr, int n) {
    if (n)
      fmt::print(fmt::format(" {} {};", n, descr));
  };
  if (n_lin + n_quad + n_nl + n_cones + n_sos1 + n_sos2) {
    fmt::print("Constraints: ");
    PrnType("linear", n_lin);
    PrnType("quadratic", n_quad);
    PrnType("nonlinear", n_nl);
    if (n_cones) {
      fmt::print(fmt::format(" {} conic (", n_cones));
      int i=0;
      for (const auto& cone: cones) {
        if (i++)
          fmt::print(" ");
        fmt::print(fmt::format("{} {}", cone.second, cone.first));
        if (int(cones.size())!=i)
          fmt::print(",");
      }
      fmt::print(");");
    }
    PrnType("SOS1", n_sos1);
    PrnType("SOS2", n_sos2);
    fmt::print("\n");
  }
  if (expr_alg.size()) {
    fmt::print("Algebraic expressions: ");
    for (const auto& expr: expr_alg)
      PrnType(expr.first.c_str(), expr.second);
    fmt::print("\n");
  }
  if (expr_logic.size()
      || n_condlin || n_condquad
      || n_indlin || n_indquad) {
    fmt::print("Logical expressions: ");
    PrnType("indicator(s)", n_indlin);
    PrnType("quadratic indicator(s)", n_indquad);
    PrnType("conditional (in)equalitie(s)", n_condlin);
    PrnType("conditional quadratic (in)equalitie(s)", n_condquad);
    for (const auto& expr: expr_logic)
      PrnType(expr.first.c_str(), expr.second);
    fmt::print("\n");
  }
  fmt::print("\n");
}